

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O3

int find(char *name)

{
  char cVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  cVar1 = *name;
  iVar6 = (int)cVar1;
  if (iVar6 == 0) {
    iVar3 = 0;
    iVar6 = 1;
  }
  else {
    iVar7 = (int)name[1];
    if (name[1] == '\0') {
      iVar3 = (int)(short)cVar1;
      iVar6 = iVar6 * 3;
    }
    else {
      if (name[2] == '\0') {
        iVar3 = iVar6 * 0x1f + iVar7;
      }
      else {
        iVar3 = iVar7 * 0x1f + (int)name[2] + iVar6 * 0x47;
      }
      iVar6 = iVar7 * 3 + (short)cVar1 * 0x33;
    }
  }
  uVar8 = ((uint)((short)iVar6 * -0x64b3) >> 0x10) + iVar6;
  sVar5 = (short)iVar6 + (((short)uVar8 >> 7) + (short)((uVar8 & 0xffff) >> 0xf)) * -0xd3;
  uVar8 = ((uint)((short)iVar3 * -0x64b3) >> 0x10) + iVar3;
  sVar2 = (short)iVar3 + (((short)uVar8 >> 7) + (short)((uVar8 & 0xffff) >> 0xf)) * -0xd3;
  iVar6 = (int)sVar2;
  lVar4 = (long)sVar2;
  if (symbols[lVar4].notempty != '\0') {
    do {
      iVar3 = strcmp(symbols[lVar4].name,name);
      if (iVar3 == 0) {
        return iVar6;
      }
      iVar6 = (iVar6 + (short)(sVar5 + (ushort)(sVar5 == 0))) % 0xd3;
      lVar4 = (long)iVar6;
    } while (symbols[lVar4].notempty != '\0');
  }
  return iVar6;
}

Assistant:

static int find(const char *name) {
// returns hash entry if it exists, or first empty slot:
  int pos = name[0] ? (
    name[1] ? (
      name[2] ? 71*name[0]+31*name[1]+name[2] : 31*name[0]+name[1]
    ) :
      name[0]
  ) : 0;
  pos %= MAXSYMBOL;
  int hh2 = name[0] ? (
    (name[1]) ? 51*name[0]+3*name[1] : 3*name[0]
    ) : 1;
  hh2 %= MAXSYMBOL; if (!hh2) hh2 = 1;
  for (;;) {
    if (!symbols[pos].notempty) return pos;
    if (!strcmp(symbols[pos].name,name)) return pos;
    pos = (pos + hh2) % MAXSYMBOL;
  }
}